

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_utility.h
# Opt level: O2

float imageio::convertSFloatToFloat(uint32_t rawBits,uint32_t numBits)

{
  float fVar1;
  
  if (numBits == 0x10) {
    fVar1 = half_to_float((uint16_t)rawBits);
    return fVar1;
  }
  if (numBits == 0x20) {
    return (float)rawBits;
  }
  __assert_fail("numBits == 16 || numBits == 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                ,0xad,"float imageio::convertSFloatToFloat(uint32_t, uint32_t)");
}

Assistant:

[[nodiscard]] inline float convertSFloatToFloat(uint32_t rawBits, uint32_t numBits) {
    assert(numBits == 16 || numBits == 32);
    if (numBits == 16)
        return half_to_float(static_cast<uint16_t>(rawBits));
    if (numBits == 32)
        return bit_cast<float>(rawBits);
    return 0;
}